

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

int __thiscall
QStyleSheetStyle::pixelMetric(QStyleSheetStyle *this,PixelMetric m,QStyleOption *opt,QWidget *w)

{
  long lVar1;
  ulong uVar2;
  QStyleSheetStyle *pQVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  QStyle *pQVar7;
  QSize QVar8;
  QSize QVar9;
  QToolButton *pQVar10;
  QStyleOptionToolButton *pQVar11;
  QStyleOptionSlider *pQVar12;
  QObject *obj;
  QCheckBox *pQVar13;
  ulong uVar14;
  int iVar15;
  char cVar16;
  long in_FS_OFFSET;
  bool bVar17;
  QLatin1StringView sh;
  QSize local_1e8;
  QFontMetrics fm;
  QRenderRule subRule;
  QRenderRule rule;
  QRenderRule subRule_1;
  
  pQVar3 = globalStyleSheetStyle;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar7 = baseStyle(this);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      iVar5 = (**(code **)(*(long *)pQVar7 + 0xe0))
                        (pQVar7,m,opt,w,*(code **)(*(long *)pQVar7 + 0xe0));
      return iVar5;
    }
    goto LAB_0034dc84;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  memset(&rule,0xaa,0x88);
  renderRule(&rule,this,&w->super_QObject,opt,0);
  memset(&subRule,0xaa,0x88);
  QRenderRule::QRenderRule(&subRule);
  if (PM_ScrollView_ScrollBarOverlap < m) goto switchD_0034d146_caseD_6;
  iVar5 = 0x21;
  switch(m) {
  case PM_ButtonMargin:
  case PM_ButtonDefaultIndicator:
  case PM_ButtonShiftHorizontal:
  case PM_ButtonShiftVertical:
switchD_0034d146_caseD_0:
    if (rule.b.d.ptr == (QStyleSheetBoxData *)0x0) break;
LAB_0034d691:
    QVar8.wd.m_i = 0;
    QVar8.ht.m_i = 0;
    goto LAB_0034dbbd;
  case PM_MenuButtonIndicator:
    pQVar10 = QtPrivate::qobject_cast_helper<QToolButton_const*,QObject_const>(&w->super_QObject);
    if (pQVar10 == (QToolButton *)0x0) {
      iVar5 = 7;
    }
    else {
      QVar8.wd.m_i = 0;
      QVar8.ht.m_i = 0;
      if ((rule.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
         ((rule.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
          ((*(long *)((long)rule.bd.d.ptr + 0x68) != 0 ||
           (*(int *)((long)rule.bd.d.ptr + 0x38) != 0xc)))))) goto LAB_0034dbbd;
      pQVar11 = qstyleoption_cast<QStyleOptionToolButton_const*>(opt);
      if (pQVar11 == (QStyleOptionToolButton *)0x0) break;
      if (((pQVar11->features).
           super_QFlagsStorageHelper<QStyleOptionToolButton::ToolButtonFeature,_4>.
           super_QFlagsStorage<QStyleOptionToolButton::ToolButtonFeature>.i & 4) == 0) {
        iVar5 = 0x13;
      }
      else {
        iVar5 = 0x11;
      }
    }
    renderRule(&subRule_1,this,&w->super_QObject,opt,iVar5);
    QRenderRule::operator=(&subRule,&subRule_1);
    QRenderRule::~QRenderRule(&subRule_1);
    bVar17 = QRenderRule::hasContentsSize(&subRule);
    if (bVar17) {
      QVar8 = QRenderRule::size(&subRule);
      goto LAB_0034dbbd;
    }
    break;
  case PM_DefaultFrameWidth:
    if ((rule.bd.d.ptr != (QStyleSheetBorderData *)0x0) &&
       ((*(long *)((long)rule.bd.d.ptr + 0x68) != 0 || (*(int *)((long)rule.bd.d.ptr + 0x38) != 0xc)
        ))) {
      QVar8.ht.m_i = 0;
      QVar8.wd.m_i = *(uint *)((long)rule.bd.d.ptr + 0x10);
      goto LAB_0034dbbd;
    }
    break;
  case PM_ScrollBarExtent:
    bVar17 = QRenderRule::hasContentsSize(&rule);
    if (bVar17) {
      QVar9 = QRenderRule::size(&rule);
      QVar8 = (QSize)((ulong)QVar9 >> 0x20);
      pQVar12 = qstyleoption_cast<QStyleOptionSlider_const*>(opt);
      if (pQVar12 == (QStyleOptionSlider *)0x0) {
LAB_0034db17:
        bVar17 = QVar9.wd.m_i.m_i == -1;
      }
      else {
        bVar17 = pQVar12->orientation == Horizontal;
      }
      if (!bVar17) {
        QVar8 = QVar9;
      }
      QVar8 = (QSize)((ulong)QVar8 & 0xffffffff);
      goto LAB_0034dbbd;
    }
    break;
  case PM_ScrollBarSliderMin:
    bVar17 = hasStyleRule(this,&w->super_QObject,0x15);
    if (bVar17) {
      renderRule(&subRule_1,this,&w->super_QObject,opt,0x15);
      QRenderRule::operator=(&subRule,&subRule_1);
      QRenderRule::~QRenderRule(&subRule_1);
      QVar9 = QRenderRule::minimumSize(&subRule);
      QVar8 = (QSize)((ulong)QVar9 >> 0x20);
      pQVar12 = qstyleoption_cast<QStyleOptionSlider_const*>(opt);
      if (pQVar12 == (QStyleOptionSlider *)0x0) goto LAB_0034db17;
      if (pQVar12->orientation == Horizontal) {
        QVar8 = QVar9;
      }
      QVar8 = (QSize)((ulong)QVar8 & 0xffffffff);
      goto LAB_0034dbbd;
    }
    break;
  case PM_SliderThickness:
  case PM_SliderLength:
    bVar17 = QRenderRule::hasContentsSize(&rule);
    if (bVar17) {
      cVar16 = (char)(opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                     super_QFlagsStorage<QStyle::StateFlag>.i;
      if (m == PM_SliderThickness) {
        QVar9 = QRenderRule::size(&rule);
        QVar8 = (QSize)((ulong)QVar9 >> 0x20);
        if (-1 < cVar16) {
          QVar8 = QVar9;
        }
        QVar8 = (QSize)((ulong)QVar8 & 0xffffffff);
      }
      else {
        if (rule.geo.d.ptr == (QStyleSheetGeometryData *)0x0) {
          uVar14 = 0;
        }
        else {
          uVar14 = *(ulong *)((long)rule.geo.d.ptr + 4);
        }
        uVar2 = uVar14 >> 0x20;
        if (cVar16 < '\0') {
          uVar2 = uVar14;
        }
        QVar8 = (QSize)(uVar2 & 0xffffffff);
      }
      goto LAB_0034dbbd;
    }
    break;
  case PM_SliderControlThickness:
    QVar8 = (QSize)&subRule_1;
    memset((void *)QVar8,0xaa,0x88);
    renderRule((QRenderRule *)QVar8,this,&w->super_QObject,opt,0x32);
    bVar17 = QRenderRule::hasContentsSize((QRenderRule *)QVar8);
    if (bVar17) {
      QVar8 = QRenderRule::size(&subRule_1);
      QVar8 = (QSize)((ulong)QVar8 >>
                     ((byte)(opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                            super_QFlagsStorage<QStyle::StateFlag>.i >> 2 & 0x20));
    }
    goto LAB_0034d9eb;
  case PM_DockWidgetSeparatorExtent:
    QVar8 = (QSize)&subRule_1;
    memset((void *)QVar8,0xaa,0x88);
    renderRule((QRenderRule *)QVar8,this,&w->super_QObject,opt,0x3d);
    bVar17 = QRenderRule::hasContentsSize((QRenderRule *)QVar8);
    if (bVar17) {
      QVar9 = QRenderRule::size(&subRule_1);
      QVar8 = (QSize)((ulong)QVar9 >> 0x20);
      if (QVar9.ht.m_i.m_i < QVar9.wd.m_i.m_i) {
        QVar8 = (QSize)((ulong)QVar9 & 0xffffffff);
      }
    }
LAB_0034d9eb:
    QRenderRule::~QRenderRule(&subRule_1);
    bVar17 = bVar17 == false;
LAB_0034db96:
    if (bVar17) break;
    goto LAB_0034dbbd;
  case PM_DockWidgetFrameWidth:
  case PM_ToolTipLabelFrameWidth:
    bVar17 = QRenderRule::hasDrawable(&rule);
    if (bVar17) {
      iVar5 = 0;
      iVar15 = 0;
      if (rule.bd.d.ptr != (QStyleSheetBorderData *)0x0) {
        iVar15 = *(int *)((long)rule.bd.d.ptr + 0x10);
      }
      if (rule.b.d.ptr != (QStyleSheetBoxData *)0x0) {
        iVar5 = *(int *)((long)rule.b.d.ptr + 0x20) + *(int *)((long)rule.b.d.ptr + 0x10);
      }
      goto LAB_0034db0f;
    }
    break;
  case PM_TabBarTabHSpace:
  case PM_TabBarTabVSpace:
    renderRule(&subRule_1,this,&w->super_QObject,opt,0x2e);
    QRenderRule::operator=(&subRule,&subRule_1);
    QRenderRule::~QRenderRule(&subRule_1);
    if (subRule.bd.d.ptr != (QStyleSheetBorderData *)0x0 ||
        subRule.b.d.ptr != (QStyleSheetBoxData *)0x0) goto LAB_0034d691;
    break;
  case PM_TabBarBaseOverlap:
    obj = (QObject *)
          QtPrivate::qobject_cast_helper<QTabWidget_const*,QObject_const>(&w->super_QObject);
    if (w != (QWidget *)0x0 && obj == (QObject *)0x0) {
      obj = *(QObject **)(*(long *)&w->field_0x8 + 0x10);
    }
    bVar17 = hasStyleRule(this,obj,0x36);
    if (bVar17) goto LAB_0034d691;
    break;
  case PM_ProgressBarChunkWidth:
    renderRule(&subRule_1,this,&w->super_QObject,opt,0x2d);
    QRenderRule::operator=(&subRule,&subRule_1);
    QRenderRule::~QRenderRule(&subRule_1);
    bVar17 = QRenderRule::hasContentsSize(&subRule);
    if (bVar17) {
      QVar9 = QRenderRule::size(&subRule);
      QVar8 = (QSize)((ulong)QVar9 >> 0x20);
      if (((opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
           super_QFlagsStorage<QStyle::StateFlag>.i & 0x80) != 0) {
        QVar8 = QVar9;
      }
      QVar8 = (QSize)((ulong)QVar8 & 0xffffffff);
      goto LAB_0034dbbd;
    }
    break;
  case PM_SplitterWidth:
    iVar5 = 0x20;
    goto switchD_0034d146_caseD_35;
  case PM_TitleBarHeight:
    QVar8 = (QSize)&subRule_1;
    memset((void *)QVar8,0xaa,0x88);
    renderRule((QRenderRule *)QVar8,this,&w->super_QObject,opt,0x41);
    bVar17 = QRenderRule::hasContentsSize((QRenderRule *)QVar8);
    if (bVar17) {
      QVar8 = QRenderRule::size(&subRule_1);
LAB_0034dc60:
      QVar8 = (QSize)((ulong)QVar8 >> 0x20);
      bVar17 = false;
    }
    else {
      if (subRule_1.bd.d.ptr != (QStyleSheetBorderData *)0x0 ||
          subRule_1.b.d.ptr != (QStyleSheetBoxData *)0x0) {
        _fm = &DAT_aaaaaaaaaaaaaaaa;
        if (opt == (QStyleOption *)0x0) {
          QWidget::fontMetrics((QWidget *)&fm);
        }
        else {
          QFontMetrics::QFontMetrics(&fm,&opt->fontMetrics);
        }
        local_1e8.ht.m_i = QFontMetrics::height();
        local_1e8.wd.m_i = 0;
        QVar8 = QRenderRule::size(&subRule_1,&local_1e8);
        QFontMetrics::~QFontMetrics(&fm);
        goto LAB_0034dc60;
      }
      bVar17 = true;
    }
    QRenderRule::~QRenderRule(&subRule_1);
    goto LAB_0034d226;
  case PM_MenuScrollerHeight:
  case PM_MenuTearoffHeight:
    renderRule(&subRule_1,this,&w->super_QObject,opt,(m == PM_MenuTearoffHeight) + 0x23);
    QRenderRule::operator=(&subRule,&subRule_1);
    QRenderRule::~QRenderRule(&subRule_1);
    bVar17 = QRenderRule::hasContentsSize(&subRule);
    if (bVar17) {
      QVar8 = QRenderRule::size(&subRule);
LAB_0034d2cc:
      QVar8 = (QSize)((ulong)QVar8 >> 0x20);
      goto LAB_0034dbbd;
    }
    break;
  case PM_MenuHMargin:
  case PM_MenuBarHMargin:
    if (rule.b.d.ptr != (QStyleSheetBoxData *)0x0) {
      QVar8.ht.m_i = 0;
      QVar8.wd.m_i = *(uint *)((long)rule.b.d.ptr + 0x20);
      goto LAB_0034dbbd;
    }
    break;
  case PM_MenuVMargin:
  case PM_MenuBarVMargin:
    if (rule.b.d.ptr != (QStyleSheetBoxData *)0x0) {
      QVar8.ht.m_i = 0;
      QVar8.wd.m_i = *(uint *)((long)rule.b.d.ptr + 0x14);
      goto LAB_0034dbbd;
    }
    break;
  case PM_MenuPanelWidth:
  case PM_MenuBarPanelWidth:
    if (rule.bd.d.ptr == (QStyleSheetBorderData *)0x0) {
      iVar5 = 0;
      if (rule.b.d.ptr == (QStyleSheetBoxData *)0x0) break;
    }
    else {
      iVar5 = *(int *)((long)rule.bd.d.ptr + 0x10);
      if (rule.b.d.ptr == (QStyleSheetBoxData *)0x0) {
LAB_0034d5ec:
        iVar15 = 0;
        goto LAB_0034db0f;
      }
    }
    iVar15 = *(int *)((long)rule.b.d.ptr + 0x10);
    goto LAB_0034db0f;
  case PM_MenuBarItemSpacing:
  case PM_ToolBarItemSpacing:
  case PM_RadioButtonLabelSpacing:
    goto LAB_0034da63;
  case PM_IndicatorWidth:
  case PM_IndicatorHeight:
  case PM_ExclusiveIndicatorWidth:
  case PM_ExclusiveIndicatorHeight:
    renderRule(&subRule_1,this,&w->super_QObject,opt,5);
    QRenderRule::operator=(&subRule,&subRule_1);
    QRenderRule::~QRenderRule(&subRule_1);
    bVar17 = QRenderRule::hasContentsSize(&subRule);
    if (bVar17) {
      QVar8 = QRenderRule::size(&subRule);
      if ((m & ~PM_MenuButtonIndicator) != PM_IndicatorWidth) goto LAB_0034d2cc;
      goto LAB_0034dbbd;
    }
    break;
  case PM_MdiSubWindowFrameWidth:
    if (rule.b.d.ptr != (QStyleSheetBoxData *)0x0 || rule.bd.d.ptr != (QStyleSheetBorderData *)0x0)
    {
      iVar15 = 0;
      iVar5 = 0;
      if (rule.bd.d.ptr != (QStyleSheetBorderData *)0x0) {
        iVar5 = *(int *)((long)rule.bd.d.ptr + 0x10);
      }
      if (rule.b.d.ptr != (QStyleSheetBoxData *)0x0) {
        iVar15 = *(int *)((long)rule.b.d.ptr + 0x10) + *(int *)((long)rule.b.d.ptr + 0x20);
      }
      QVar8.wd.m_i = iVar15 + iVar5;
      QVar8.ht.m_i = 0;
      goto LAB_0034dbbd;
    }
    break;
  case PM_MdiSubWindowMinimizedWidth:
    memset(&subRule_1,0xaa,0x88);
    renderRule(&subRule_1,this,&w->super_QObject,0,0x800000000);
    QVar8 = QRenderRule::size(&subRule_1);
    QRenderRule::~QRenderRule(&subRule_1);
    goto LAB_0034da70;
  case PM_TabBarTabShiftHorizontal:
  case PM_TabBarTabShiftVertical:
    renderRule(&subRule_1,this,&w->super_QObject,opt,0x2e);
    QRenderRule::operator=(&subRule,&subRule_1);
    QRenderRule::~QRenderRule(&subRule_1);
    if (subRule.b.d.ptr != (QStyleSheetBoxData *)0x0) goto LAB_0034d691;
    break;
  case PM_TabBarScrollButtonWidth:
    renderRule(&subRule_1,this,&w->super_QObject,opt,0x2f);
    QRenderRule::operator=(&subRule,&subRule_1);
    QRenderRule::~QRenderRule(&subRule_1);
    bVar17 = QRenderRule::hasContentsSize(&subRule);
    if (!bVar17) break;
    QVar9 = QRenderRule::size(&subRule);
    QVar8 = (QSize)((ulong)QVar9 >> 0x20);
    if (QVar9.wd.m_i.m_i != -1) {
      QVar8 = QVar9;
    }
    uVar6 = (uint)((long)((ulong)(uint)(QVar8.wd.m_i.m_i >> 0x1f) << 0x20 |
                         (ulong)QVar8 & 0xffffffff) / 2);
    goto LAB_0034dbba;
  case PM_ToolBarFrameWidth:
    if (rule.bd.d.ptr == (QStyleSheetBorderData *)0x0) {
      iVar5 = 0;
      if (rule.b.d.ptr == (QStyleSheetBoxData *)0x0) break;
    }
    else {
      iVar5 = *(int *)((long)rule.bd.d.ptr + 0x10);
      if (rule.b.d.ptr == (QStyleSheetBoxData *)0x0) goto LAB_0034d5ec;
    }
    iVar15 = *(int *)((long)rule.b.d.ptr + 0x20);
LAB_0034db0f:
    QVar8.wd.m_i = iVar5 + iVar15;
    QVar8.ht.m_i = 0;
    goto LAB_0034dbbd;
  case PM_ToolBarHandleExtent:
    goto switchD_0034d146_caseD_35;
  case PM_ToolBarItemMargin:
  case PM_DockWidgetTitleBarButtonMargin:
    if (rule.b.d.ptr != (QStyleSheetBoxData *)0x0) {
      QVar8.ht.m_i = 0;
      QVar8.wd.m_i = *(uint *)((long)rule.b.d.ptr + 4);
      goto LAB_0034dbbd;
    }
    break;
  case PM_ToolBarSeparatorExtent:
    iVar5 = 0x22;
switchD_0034d146_caseD_35:
    renderRule(&subRule_1,this,&w->super_QObject,opt,iVar5);
    QRenderRule::operator=(&subRule,&subRule_1);
    QRenderRule::~QRenderRule(&subRule_1);
    bVar17 = QRenderRule::hasContentsSize(&subRule);
    if (!bVar17) break;
    QVar9 = QRenderRule::size(&subRule);
    QVar8 = (QSize)((ulong)QVar9 >> 0x20);
    if ((opt != (QStyleOption *)0x0) &&
       (((opt->state).super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
         super_QFlagsStorage<QStyle::StateFlag>.i & 0x80) != 0)) {
      QVar8 = (QSize)((ulong)QVar9 & 0xffffffff);
    }
    goto LAB_0034dbbd;
  case PM_ToolBarIconSize:
  case PM_ListViewIconSize:
  case PM_IconViewIconSize:
  case PM_SmallIconSize:
  case PM_TabBarIconSize:
  case PM_MessageBoxIconSize:
  case PM_ButtonIconSize:
    QVar8 = (QSize)&subRule_1;
    subRule_1._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    subRule_1._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
    subRule_1._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    subRule_1._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    sh.m_data = "icon-size";
    sh.m_size = 9;
    QRenderRule::styleHint((QVariant *)QVar8,&rule,sh);
    bVar17 = true;
    if ((3 < (ulong)subRule_1._24_8_) &&
       (bVar4 = ::QVariant::canConvert<QSize>((QVariant *)&subRule_1), bVar4)) {
      QVar8 = (QSize)::QVariant::toSize();
      bVar17 = false;
    }
    ::QVariant::~QVariant((QVariant *)&subRule_1);
LAB_0034d226:
    if (bVar17) break;
    goto LAB_0034dbbd;
  case PM_CheckBoxLabelSpacing:
    pQVar13 = QtPrivate::qobject_cast_helper<QCheckBox_const*,QObject_const>(&w->super_QObject);
    if (((pQVar13 != (QCheckBox *)0x0) && (rule.b.d.ptr != (QStyleSheetBoxData *)0x0)) &&
       (QVar8.ht.m_i = 0, QVar8.wd.m_i = *(uint *)((long)rule.b.d.ptr + 0x24),
       *(uint *)((long)rule.b.d.ptr + 0x24) != 0xffffffff)) goto LAB_0034dbbd;
    renderRule(&subRule_1,this,&w->super_QObject,opt,0xf);
    QRenderRule::operator=(&subRule,&subRule_1);
    QRenderRule::~QRenderRule(&subRule_1);
    rule.b = subRule.b;
LAB_0034da63:
    if (rule.b.d.ptr == (QStyleSheetBoxData *)0x0) break;
    QVar8.ht.m_i = 0;
    QVar8.wd.m_i = ((QStyleSheetBoxData *)rule.b.d.ptr)->spacing;
LAB_0034da70:
    if (QVar8.wd.m_i.m_i == -1) break;
    goto LAB_0034dbbd;
  case PM_DockWidgetTitleMargin:
    QVar8 = (QSize)&subRule_1;
    memset((void *)QVar8,0xaa,0x88);
    renderRule((QRenderRule *)QVar8,this,&w->super_QObject,opt,0x3a);
    if (subRule_1.b.d.ptr != (QStyleSheetBoxData *)0x0) {
      if (subRule_1.bd.d.ptr == (QStyleSheetBorderData *)0x0) {
        iVar5 = 0;
      }
      else {
        iVar5 = *(int *)((long)subRule_1.bd.d.ptr + 4);
      }
      QVar8.wd.m_i = iVar5 + *(int *)((long)subRule_1.b.d.ptr + 4) +
                     *(int *)((long)subRule_1.b.d.ptr + 0x14);
      QVar8.ht.m_i = 0;
    }
    QRenderRule::~QRenderRule(&subRule_1);
    bVar17 = subRule_1.b.d.ptr == (QStyleSheetBoxData *)0x0;
    goto LAB_0034db96;
  case PM_ScrollView_ScrollBarSpacing:
    if (rule.bd.d.ptr == (QStyleSheetBorderData *)0x0) goto switchD_0034d146_caseD_0;
    QVar8.wd.m_i = 0;
    QVar8.ht.m_i = 0;
    QVar9.wd.m_i = 0;
    QVar9.ht.m_i = 0;
    if (((*(long *)((long)rule.bd.d.ptr + 0x68) != 0) ||
        (QVar8 = QVar9, *(int *)((long)rule.bd.d.ptr + 0x38) != 0xc)) ||
       (rule.b.d.ptr != (QStyleSheetBoxData *)0x0)) goto LAB_0034dbbd;
    break;
  case PM_ScrollView_ScrollBarOverlap:
    pQVar7 = QStyle::proxy((QStyle *)
                           ((long)&switchD_0034d146::switchdataD_005f495c +
                           (long)(int)(&switchD_0034d146::switchdataD_005f495c)[m]));
    QVar8.wd.m_i = 0;
    QVar8.ht.m_i = 0;
    iVar5 = (**(code **)(*(long *)pQVar7 + 0xf0))(pQVar7,0x60,opt,w,0);
    if (iVar5 == 0) goto LAB_0034dbbd;
  }
switchD_0034d146_caseD_6:
  pQVar7 = baseStyle(this);
  uVar6 = (**(code **)(*(long *)pQVar7 + 0xe0))(pQVar7,m,opt,w);
LAB_0034dbba:
  QVar8.ht.m_i = 0;
  QVar8.wd.m_i = uVar6;
LAB_0034dbbd:
  QRenderRule::~QRenderRule(&subRule);
  QRenderRule::~QRenderRule(&rule);
  if (pQVar3 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)QVar8.wd.m_i;
  }
LAB_0034dc84:
  __stack_chk_fail();
}

Assistant:

int QStyleSheetStyle::pixelMetric(PixelMetric m, const QStyleOption *opt, const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->pixelMetric(m, opt, w))

    QRenderRule rule = renderRule(w, opt);
    QRenderRule subRule;

    switch (m) {
    case PM_MenuButtonIndicator:
#if QT_CONFIG(toolbutton)
        // QToolButton adds this directly to the width
        if (qobject_cast<const QToolButton *>(w)) {
            if (rule.hasBox() || !rule.hasNativeBorder())
                return 0;
            if (const auto *tbOpt = qstyleoption_cast<const QStyleOptionToolButton*>(opt)) {
                if (tbOpt->features & QStyleOptionToolButton::MenuButtonPopup)
                    subRule = renderRule(w, opt, PseudoElement_ToolButtonMenu);
                else
                    subRule = renderRule(w, opt, PseudoElement_ToolButtonMenuIndicator);
                if (subRule.hasContentsSize())
                    return subRule.size().width();
            }
            break;
        }
#endif
        subRule = renderRule(w, opt, PseudoElement_PushButtonMenuIndicator);
        if (subRule.hasContentsSize())
            return subRule.size().width();
        break;

    case PM_ButtonShiftHorizontal:
    case PM_ButtonShiftVertical:
    case PM_ButtonMargin:
    case PM_ButtonDefaultIndicator:
        if (rule.hasBox())
            return 0;
        break;

    case PM_DefaultFrameWidth:
        if (!rule.hasNativeBorder())
            return rule.border()->borders[LeftEdge];
        break;

    case PM_ExclusiveIndicatorWidth:
    case PM_IndicatorWidth:
    case PM_ExclusiveIndicatorHeight:
    case PM_IndicatorHeight:
        subRule = renderRule(w, opt, PseudoElement_Indicator);
        if (subRule.hasContentsSize()) {
            return (m == PM_ExclusiveIndicatorWidth) || (m == PM_IndicatorWidth)
                        ? subRule.size().width() : subRule.size().height();
        }
        break;

    case PM_DockWidgetFrameWidth:
    case PM_ToolTipLabelFrameWidth: // border + margin + padding (support only one width)
        if (!rule.hasDrawable())
            break;

        return (rule.border() ? rule.border()->borders[LeftEdge] : 0)
                + (rule.hasBox() ? rule.box()->margins[LeftEdge] + rule.box()->paddings[LeftEdge]: 0);

    case PM_ToolBarFrameWidth:
        if (rule.hasBorder() || rule.hasBox())
            return (rule.border() ? rule.border()->borders[LeftEdge] : 0)
                   + (rule.hasBox() ? rule.box()->paddings[LeftEdge]: 0);
        break;

    case PM_MenuPanelWidth:
    case PM_MenuBarPanelWidth:
        if (rule.hasBorder() || rule.hasBox())
            return (rule.border() ? rule.border()->borders[LeftEdge] : 0)
                   + (rule.hasBox() ? rule.box()->margins[LeftEdge]: 0);
        break;


    case PM_MenuHMargin:
    case PM_MenuBarHMargin:
        if (rule.hasBox())
            return rule.box()->paddings[LeftEdge];
        break;

    case PM_MenuVMargin:
    case PM_MenuBarVMargin:
        if (rule.hasBox())
            return rule.box()->paddings[TopEdge];
        break;

    case PM_DockWidgetTitleBarButtonMargin:
    case PM_ToolBarItemMargin:
        if (rule.hasBox())
            return rule.box()->margins[TopEdge];
        break;

    case PM_ToolBarItemSpacing:
    case PM_MenuBarItemSpacing:
        if (rule.hasBox() && rule.box()->spacing != -1)
            return rule.box()->spacing;
        break;

    case PM_MenuTearoffHeight:
    case PM_MenuScrollerHeight: {
        PseudoElement ps = m == PM_MenuTearoffHeight ? PseudoElement_MenuTearoff : PseudoElement_MenuScroller;
        subRule = renderRule(w, opt, ps);
        if (subRule.hasContentsSize())
            return subRule.size().height();
        break;
                                }

    case PM_ToolBarExtensionExtent:
        break;

    case PM_SplitterWidth:
    case PM_ToolBarSeparatorExtent:
    case PM_ToolBarHandleExtent: {
        PseudoElement ps;
        if (m == PM_ToolBarHandleExtent) ps = PseudoElement_ToolBarHandle;
        else if (m == PM_SplitterWidth) ps = PseudoElement_SplitterHandle;
        else ps = PseudoElement_ToolBarSeparator;
        subRule = renderRule(w, opt, ps);
        if (subRule.hasContentsSize()) {
            QSize sz = subRule.size();
            return (opt && opt->state & QStyle::State_Horizontal) ? sz.width() : sz.height();
        }
        break;
                                 }

    case PM_RadioButtonLabelSpacing:
        if (rule.hasBox() && rule.box()->spacing != -1)
            return rule.box()->spacing;
        break;
    case PM_CheckBoxLabelSpacing:
#if QT_CONFIG(checkbox)
        if (qobject_cast<const QCheckBox *>(w)) {
            if (rule.hasBox() && rule.box()->spacing != -1)
                return rule.box()->spacing;
        }
#endif
        // assume group box
        subRule = renderRule(w, opt, PseudoElement_GroupBoxTitle);
        if (subRule.hasBox() && subRule.box()->spacing != -1)
            return subRule.box()->spacing;
        break;

#if QT_CONFIG(scrollbar)
    case PM_ScrollBarExtent:
        if (rule.hasContentsSize()) {
            QSize sz = rule.size();
            if (const QStyleOptionSlider *sb = qstyleoption_cast<const QStyleOptionSlider *>(opt))
                return sb->orientation == Qt::Horizontal ? sz.height() : sz.width();
            return sz.width() == -1 ? sz.height() : sz.width();
        }
        break;

    case PM_ScrollBarSliderMin:
        if (hasStyleRule(w, PseudoElement_ScrollBarSlider)) {
            subRule = renderRule(w, opt, PseudoElement_ScrollBarSlider);
            QSize msz = subRule.minimumSize();
            if (const QStyleOptionSlider *sb = qstyleoption_cast<const QStyleOptionSlider *>(opt))
                return sb->orientation == Qt::Horizontal ? msz.width() : msz.height();
            return msz.width() == -1 ? msz.height() : msz.width();
        }
        break;

    case PM_ScrollView_ScrollBarSpacing:
        if (!rule.hasNativeBorder() || rule.hasBox())
            return 0;
        break;

    case PM_ScrollView_ScrollBarOverlap:
        if (!proxy()->styleHint(SH_ScrollBar_Transient, opt, w))
            return 0;
        break;
#endif // QT_CONFIG(scrollbar)


    case PM_ProgressBarChunkWidth:
        subRule = renderRule(w, opt, PseudoElement_ProgressBarChunk);
        if (subRule.hasContentsSize()) {
            QSize sz = subRule.size();
            return (opt->state & QStyle::State_Horizontal)
                   ? sz.width() : sz.height();
        }
        break;

#if QT_CONFIG(tabwidget)
    case PM_TabBarTabHSpace:
    case PM_TabBarTabVSpace:
        subRule = renderRule(w, opt, PseudoElement_TabBarTab);
        if (subRule.hasBox() || subRule.hasBorder())
            return 0;
        break;

    case PM_TabBarScrollButtonWidth:
        subRule = renderRule(w, opt, PseudoElement_TabBarScroller);
        if (subRule.hasContentsSize()) {
            QSize sz = subRule.size();
            return (sz.width() != -1 ? sz.width() : sz.height()) / 2;
        }
        break;

    case PM_TabBarTabShiftHorizontal:
    case PM_TabBarTabShiftVertical:
        subRule = renderRule(w, opt, PseudoElement_TabBarTab);
        if (subRule.hasBox())
            return 0;
        break;

    case PM_TabBarBaseOverlap: {
        const QWidget *tabWidget = qobject_cast<const QTabWidget *>(w);
        if (!tabWidget && w)
            tabWidget = w->parentWidget();
        if (hasStyleRule(tabWidget, PseudoElement_TabWidgetPane)) {
            return 0;
        }
        break;
    }
#endif // QT_CONFIG(tabwidget)

    case PM_SliderThickness: // horizontal slider's height (sizeHint)
    case PM_SliderLength: // minimum length of slider
        if (rule.hasContentsSize()) {
            bool horizontal = opt->state & QStyle::State_Horizontal;
            if (m == PM_SliderThickness) {
                QSize sz = rule.size();
                return horizontal ? sz.height() : sz.width();
            } else {
                QSize msz = rule.minimumContentsSize();
                return horizontal ? msz.width() : msz.height();
            }
        }
        break;

    case PM_SliderControlThickness: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_SliderHandle);
        if (!subRule.hasContentsSize())
            break;
        QSize size = subRule.size();
        return (opt->state & QStyle::State_Horizontal) ? size.height() : size.width();
                                    }

    case PM_ToolBarIconSize:
    case PM_ListViewIconSize:
    case PM_IconViewIconSize:
    case PM_TabBarIconSize:
    case PM_MessageBoxIconSize:
    case PM_ButtonIconSize:
    case PM_SmallIconSize: {
        const auto styleHint = rule.styleHint("icon-size"_L1);
        if (styleHint.isValid() && styleHint.canConvert<QSize>())
            return styleHint.toSize().width();
        break;
    }
    case PM_DockWidgetTitleMargin: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_DockWidgetTitle);
        if (!subRule.hasBox())
            break;
        return (subRule.border() ? subRule.border()->borders[TopEdge] : 0)
                + (subRule.hasBox() ? subRule.box()->margins[TopEdge] + subRule.box()->paddings[TopEdge]: 0);
                                   }

    case PM_DockWidgetSeparatorExtent: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_DockWidgetSeparator);
        if (!subRule.hasContentsSize())
            break;
        QSize sz = subRule.size();
        return qMax(sz.width(), sz.height());
                                        }

    case PM_TitleBarHeight: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TitleBar);
        if (subRule.hasContentsSize())
            return subRule.size().height();
        else if (subRule.hasBox() || subRule.hasBorder()) {
            QFontMetrics fm = opt ?  opt->fontMetrics : w->fontMetrics();
            return subRule.size(QSize(0, fm.height())).height();
        }
        break;
                            }

    case PM_MdiSubWindowFrameWidth:
        if (rule.hasBox() || rule.hasBorder()) {
            return (rule.border() ? rule.border()->borders[LeftEdge] : 0)
                   + (rule.hasBox() ? rule.box()->paddings[LeftEdge]+rule.box()->margins[LeftEdge]: 0);
        }
        break;

    case PM_MdiSubWindowMinimizedWidth: {
        QRenderRule subRule = renderRule(w, PseudoElement_None, PseudoClass_Minimized);
        int width = subRule.size().width();
        if (width != -1)
            return width;
        break;
                                     }
    default:
        break;
    }

    return baseStyle()->pixelMetric(m, opt, w);
}